

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcDar.c
# Opt level: O2

void Abc_NtkPrintLatchEquivClasses(Abc_Ntk_t *pNtk,Aig_Man_t *pAig)

{
  uint uVar1;
  undefined8 uVar2;
  bool bVar3;
  int iVar4;
  void *__ptr;
  void *__ptr_00;
  Abc_Obj_t *pAVar5;
  char *__s;
  size_t sVar6;
  char *__dest;
  void *pvVar7;
  ulong uVar8;
  Aig_Man_t *p;
  Aig_Man_t *pAVar9;
  ulong uVar10;
  long lVar11;
  
  uVar1 = pNtk->nObjCounts[8];
  __ptr = malloc((long)(int)uVar1 * 8);
  __ptr_00 = malloc((long)(int)uVar1 << 2);
  for (lVar11 = 0; lVar11 < pNtk->vBoxes->nSize; lVar11 = lVar11 + 1) {
    pAVar5 = Abc_NtkBox(pNtk,(int)lVar11);
    if ((*(uint *)&pAVar5->field_0x14 & 0xf) == 8) {
      __s = Abc_ObjName((Abc_Obj_t *)pAVar5->pNtk->vObjs->pArray[*(pAVar5->vFanouts).pArray]);
      sVar6 = strlen(__s);
      __dest = (char *)malloc(sVar6 + 1);
      *(char **)((long)__ptr + lVar11 * 8) = __dest;
      strcpy(__dest,__s);
    }
  }
  p = pAig;
  Aig_ManSetCioIds(pAig);
  lVar11 = 0;
  bVar3 = false;
  do {
    if (pAig->nRegs <= lVar11) {
      uVar8 = 0;
      if (0 < (int)uVar1) {
        uVar8 = (ulong)uVar1;
      }
      bVar3 = false;
      for (uVar10 = 0; uVar8 != uVar10; uVar10 = uVar10 + 1) {
        if (*(int *)((long)__ptr_00 + uVar10 * 4) == 0) {
          pAVar9 = *(Aig_Man_t **)((long)__ptr + uVar10 * 8);
        }
        else {
          if (!bVar3) {
            Abc_Print((int)p,"The following flops have been deemed irrelevant:\n");
          }
          pAVar9 = *(Aig_Man_t **)((long)__ptr + uVar10 * 8);
          Abc_Print((int)p,"%s ",pAVar9);
          bVar3 = true;
        }
        if (pAVar9 != (Aig_Man_t *)0x0) {
          free(pAVar9);
          *(undefined8 *)((long)__ptr + uVar10 * 8) = 0;
          p = pAVar9;
        }
      }
      if (bVar3) {
        Abc_Print((int)p,"\n");
      }
      free(__ptr);
      free(__ptr_00);
      return;
    }
    p = (Aig_Man_t *)pAig->vCis;
    pvVar7 = Vec_PtrEntry((Vec_Ptr_t *)p,pAig->nTruePis + (int)lVar11);
    *(undefined4 *)((long)__ptr_00 + lVar11 * 4) = 0;
    if ((pAig->pReprs != (Aig_Obj_t **)0x0) &&
       (pAVar9 = (Aig_Man_t *)pAig->pReprs[*(int *)((long)pvVar7 + 0x24)],
       pAVar9 != (Aig_Man_t *)0x0)) {
      uVar2 = *(undefined8 *)((long)__ptr + lVar11 * 8);
      if (!bVar3) {
        Abc_Print((int)p,"Here are the flop equivalences:\n");
      }
      if (((ulong)pAVar9 & 1) != 0) {
        __assert_fail("!Aig_IsComplement(pObj)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/aig/aig.h"
                      ,0x112,"int Aig_ObjIsConst1(Aig_Obj_t *)");
      }
      if (((ulong)pAVar9->vCos & 7) == 1) {
        Abc_Print((int)p,"Original flop %s is proved equivalent to constant.\n",uVar2);
        pAVar9 = p;
      }
      else {
        iVar4 = Saig_ObjIsLo(pAig,(Aig_Obj_t *)pAVar9);
        if (iVar4 == 0) {
          __assert_fail("Saig_ObjIsLo( pAig, pRepr )",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcDar.c"
                        ,0x863,"void Abc_NtkPrintLatchEquivClasses(Abc_Ntk_t *, Aig_Man_t *)");
        }
        iVar4 = Aig_ObjCioId((Aig_Obj_t *)pAVar9);
        Abc_Print((int)pAVar9,"Original flop %s is proved equivalent to flop %s.\n",uVar2,
                  *(undefined8 *)((long)__ptr + ((long)iVar4 - (long)pAig->nTruePis) * 8));
      }
      bVar3 = true;
      p = pAVar9;
    }
    lVar11 = lVar11 + 1;
  } while( true );
}

Assistant:

void Abc_NtkPrintLatchEquivClasses( Abc_Ntk_t * pNtk, Aig_Man_t * pAig )
{
    int header_dumped = 0;
    int num_orig_latches = Abc_NtkLatchNum(pNtk);
    char **pNames = ABC_ALLOC( char *, num_orig_latches );
    int *p_irrelevant = ABC_ALLOC( int, num_orig_latches );
    char * pFlopName, * pReprName;
    Aig_Obj_t * pFlop, * pRepr;
    Abc_Obj_t * pNtkFlop; 
    int repr_idx;
    int i;

    Abc_NtkForEachLatch( pNtk, pNtkFlop, i )
    {
        char *temp_name = Abc_ObjName( Abc_ObjFanout0(pNtkFlop) );
        pNames[i] = ABC_ALLOC( char , strlen(temp_name)+1);
        strcpy(pNames[i], temp_name);
    }
    i = 0;
    
    Aig_ManSetCioIds( pAig );
    Saig_ManForEachLo( pAig, pFlop, i )
    {
        p_irrelevant[i] = false;
        
        pFlopName = pNames[i];

        pRepr = Aig_ObjRepr(pAig, pFlop);

        if ( pRepr == NULL )
        {
            // Abc_Print( 1, "Nothing equivalent to flop %s\n", pFlopName);
//            p_irrelevant[i] = true;
            continue;
        }

        if (!header_dumped)
        {
            Abc_Print( 1, "Here are the flop equivalences:\n");
            header_dumped = true;
        }

        // pRepr is representative of the equivalence class, to which pFlop belongs
        if ( Aig_ObjIsConst1(pRepr) )
        {
            Abc_Print( 1, "Original flop %s is proved equivalent to constant.\n", pFlopName );
            // Abc_Print( 1, "Original flop # %d is proved equivalent to constant.\n", i );
            continue;
        }

        assert( Saig_ObjIsLo( pAig, pRepr ) );
        repr_idx = Aig_ObjCioId(pRepr) - Saig_ManPiNum(pAig);
        pReprName = pNames[repr_idx];
        Abc_Print( 1, "Original flop %s is proved equivalent to flop %s.\n",  pFlopName, pReprName );
        // Abc_Print( 1, "Original flop # %d is proved equivalent to flop # %d.\n",  i, repr_idx );
    }

    header_dumped = false;
    for (i=0; i<num_orig_latches; ++i)
    {
        if (p_irrelevant[i])
        {
            if (!header_dumped)
            {
                Abc_Print( 1, "The following flops have been deemed irrelevant:\n");
                header_dumped = true;
            }
            Abc_Print( 1, "%s ", pNames[i]);
        }
        
        ABC_FREE(pNames[i]);
    }
    if (header_dumped)
        Abc_Print( 1, "\n");
    
    ABC_FREE(pNames);
    ABC_FREE(p_irrelevant);
}